

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grammar.hpp
# Opt level: O0

void __thiscall Centaurus::Grammar<unsigned_char>::~Grammar(Grammar<unsigned_char> *this)

{
  Grammar<unsigned_char> *this_local;
  
  (this->super_IGrammar)._vptr_IGrammar = (_func_int **)&PTR__Grammar_00296558;
  GrammarOptions::~GrammarOptions(&this->m_options);
  Identifier::~Identifier(&this->m_grammar_name);
  Identifier::~Identifier(&this->m_root_id);
  std::vector<Centaurus::Identifier,_std::allocator<Centaurus::Identifier>_>::~vector
            (&this->m_identifiers);
  std::
  unordered_map<Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>_>_>
  ::~unordered_map(&this->m_networks);
  IGrammar::~IGrammar(&this->super_IGrammar);
  return;
}

Assistant:

void print(std::wostream& os, const Identifier& key, int maxdepth = 3) const
	{
		os << L"digraph " << key << L" {" << std::endl;
		os << L"rankdir=\"LR\";" << std::endl;
		os << L"graph [ charset=\"UTF-8\" ];" << std::endl;
		os << L"node [ style=\"solid,filled\" ];" << std::endl;
		os << L"edge [ style=\"solid\" ];" << std::endl;

		ATNPrinter<TCHAR> printer(m_networks, maxdepth);

		printer.print(os, key);

		os << L"}" << std::endl;
	}